

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O3

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestMembrane::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined6 in_register_00000032;
  DispatchCallResult DVar3;
  undefined8 uVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffffffff) {
  case 0:
    (**(code **)(lVar1 + 8))(this);
    uVar2 = extraout_RDX;
    break;
  case 1:
    (**(code **)(lVar1 + 0x10))(this);
    uVar2 = extraout_RDX_03;
    break;
  case 2:
    (**(code **)(lVar1 + 0x18))(this);
    uVar2 = extraout_RDX_01;
    break;
  case 3:
    (**(code **)(lVar1 + 0x20))(this);
    uVar2 = extraout_RDX_02;
    break;
  case 4:
    (**(code **)(lVar1 + 0x28))(this);
    *(undefined2 *)&this->field_0x8 = 0x100;
    uVar2 = extraout_RDX_00;
    goto LAB_00216853;
  default:
    DVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x2e2df1,0x9c0c);
    uVar2 = DVar3._8_8_;
    goto LAB_00216853;
  }
  *(undefined2 *)&this->field_0x8 = 0;
LAB_00216853:
  DVar3.isStreaming = (bool)(char)uVar2;
  DVar3.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar3.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar3;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMembrane::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        makeThing(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::MakeThingParams,  ::capnproto_test::capnp::test::TestMembrane::MakeThingResults>(context)),
        false,
        false
      };
    case 1:
      return {
        callPassThrough(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context)),
        false,
        false
      };
    case 2:
      return {
        callIntercept(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::CallInterceptParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context)),
        false,
        false
      };
    case 3:
      return {
        loopback(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::LoopbackParams,  ::capnproto_test::capnp::test::TestMembrane::LoopbackResults>(context)),
        false,
        false
      };
    case 4:
      return {
        waitForever(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::WaitForeverParams,  ::capnproto_test::capnp::test::TestMembrane::WaitForeverResults>(context)),
        false,
        true
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMembrane",
          0xc07d8dcd80a69c0cull, methodId);
  }
}